

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O3

void __thiscall
capnp::JsonCodec::addFieldHandlerImpl(JsonCodec *this,Field field,Type type,HandlerBase *handler)

{
  HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*> *table;
  RemoveConst<kj::HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*>::Entry>
  **ppRVar1;
  Impl *pIVar2;
  RemoveConst<kj::HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*>::Entry>
  *pRVar3;
  bool bVar4;
  long lVar5;
  size_t newSize;
  DebugComparison<capnp::Type_&,_capnp::Type> *pDVar6;
  RemoveConst<kj::HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*>::Entry>
  *pRVar7;
  byte bVar8;
  Fault FStack_b8;
  Fault f;
  anon_union_8_2_eba6ea51_for_Type_5 aStack_a8;
  DebugComparison<capnp::Type_&,_capnp::Type> _kjCondition;
  HandlerBase *local_40;
  Type type_local;
  
  type_local.field_4 = type.field_4;
  type_local._0_8_ = type._0_8_;
  bVar8 = 0;
  _f = StructSchema::Field::getType(&field);
  bVar4 = Type::operator==(&type_local,(Type *)&f);
  _kjCondition.right._0_8_ = f.exception;
  _kjCondition.right.field_4.schema = aStack_a8.schema;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = bVar4;
  if (!bVar4) {
    _kjCondition.left = &type_local;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::Type&,capnp::Type>&,char_const(&)[60]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
               ,900,FAILED,"type == field.getType()",
               "_kjCondition,\"handler type did not match field type for addFieldHandler()\"",
               &_kjCondition,
               (char (*) [60])"handler type did not match field type for addFieldHandler()");
    kj::_::Debug::Fault::fatal(&f);
  }
  pIVar2 = (this->impl).ptr;
  _kjCondition.op.content.size_ = (size_t)field.proto._reader.data;
  _kjCondition._40_8_ = field.proto._reader.pointers;
  _kjCondition.right.field_4.schema = (RawBrandedSchema *)field.proto._reader.segment;
  _kjCondition.op.content.ptr = (char *)field.proto._reader.capTable;
  _kjCondition.left = (Type *)field.parent.super_Schema.raw;
  _kjCondition.right._0_8_ = field._8_8_;
  table = &pIVar2->fieldHandlers;
  kj::
  Table<kj::HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*>::Entry,_kj::HashIndex<kj::HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*>::Callbacks>_>
  ::Impl<0UL,_false>::insert
            ((Impl<0UL,_false> *)&f,&table->table,
             ((long)(pIVar2->fieldHandlers).table.rows.builder.pos -
              (long)(pIVar2->fieldHandlers).table.rows.builder.ptr >> 3) * -0x71c71c71c71c71c7,
             (Entry *)&_kjCondition,0xffffffff);
  if ((char)f.exception == '\x01') {
    f.exception = (Exception *)&(table->table).rows.builder.ptr[aStack_a8.scopeId].value;
    aStack_a8.schema = (RawBrandedSchema *)&local_40;
    if (*(HandlerBase **)f.exception != handler) {
      local_40 = handler;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::JsonCodec::HandlerBase*&,capnp::JsonCodec::HandlerBase*&>&,char_const(&)[49]>
                (&FStack_b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                 ,0x386,FAILED,"existing == replacement",
                 "_kjCondition,\"field already has a different registered handler\"",
                 (DebugComparison<capnp::JsonCodec::HandlerBase_*&,_capnp::JsonCodec::HandlerBase_*&>
                  *)&f,(char (*) [49])"field already has a different registered handler");
      kj::_::Debug::Fault::fatal(&FStack_b8);
    }
  }
  else {
    pRVar7 = (pIVar2->fieldHandlers).table.rows.builder.pos;
    if (pRVar7 == (pIVar2->fieldHandlers).table.rows.builder.endPtr) {
      pRVar3 = (pIVar2->fieldHandlers).table.rows.builder.ptr;
      newSize = 4;
      if (pRVar7 != pRVar3) {
        newSize = ((long)pRVar7 - (long)pRVar3 >> 3) * 0x1c71c71c71c71c72;
      }
      kj::Vector<kj::HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*>::Entry>::
      setCapacity((Vector<kj::HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*>::Entry>
                   *)table,newSize);
      pRVar7 = (pIVar2->fieldHandlers).table.rows.builder.pos;
    }
    pDVar6 = &_kjCondition;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      (pRVar7->key).parent.super_Schema.raw = (RawBrandedSchema *)pDVar6->left;
      pDVar6 = (DebugComparison<capnp::Type_&,_capnp::Type> *)
               ((long)pDVar6 + (ulong)bVar8 * -0x10 + 8);
      pRVar7 = (RemoveConst<kj::HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*>::Entry>
                *)((long)pRVar7 + (ulong)bVar8 * -0x10 + 8);
    }
    ppRVar1 = &(pIVar2->fieldHandlers).table.rows.builder.pos;
    *ppRVar1 = *ppRVar1 + 1;
  }
  return;
}

Assistant:

void JsonCodec::addFieldHandlerImpl(StructSchema::Field field, Type type, HandlerBase& handler) {
  KJ_REQUIRE(type == field.getType(),
      "handler type did not match field type for addFieldHandler()");
  impl->fieldHandlers.upsert(field, &handler, [](HandlerBase*& existing, HandlerBase* replacement) {
    KJ_REQUIRE(existing == replacement, "field already has a different registered handler");
  });
}